

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  pointer pcVar1;
  size_t __n;
  string *psVar2;
  int iVar3;
  undefined1 *puVar4;
  bool bVar5;
  string local_pname;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [8];
  undefined8 uStack_118;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [8];
  undefined8 uStack_f8;
  undefined1 *local_f0;
  size_t local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [8];
  undefined8 uStack_b8;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (name->_M_string_length < 3) {
    bVar5 = false;
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)name);
    iVar3 = ::std::__cxx11::string::compare((char *)local_50);
    bVar5 = iVar3 == 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  if (bVar5) {
    ::std::__cxx11::string::substr((ulong)&local_90,(ulong)name);
    bVar5 = check_lname(this,&local_90);
    psVar2 = &local_90;
  }
  else {
    if (name->_M_string_length < 2) {
      bVar5 = false;
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)name);
      iVar3 = ::std::__cxx11::string::compare((char *)local_70);
      bVar5 = iVar3 == 0;
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
    if (!bVar5) {
      pcVar1 = (this->pname_)._M_dataplus._M_p;
      local_f0 = local_e0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar1,pcVar1 + (this->pname_)._M_string_length);
      if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
        local_110 = local_100;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_f0,local_f0 + local_e8);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_110,local_110 + local_108,local_110);
        if (local_110 == local_100) {
          uStack_b8 = uStack_f8;
          local_d0 = local_c0;
        }
        else {
          local_d0 = local_110;
        }
        local_c8 = local_108;
        local_108 = 0;
        local_100[0] = 0;
        local_110 = local_100;
        ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
        if (local_110 != local_100) {
          operator_delete(local_110);
        }
        pcVar1 = (name->_M_dataplus)._M_p;
        local_130 = local_120;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar1,pcVar1 + name->_M_string_length);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_130,local_130 + local_128,local_130);
        if (local_130 == local_120) {
          uStack_b8 = uStack_118;
          local_d0 = local_c0;
        }
        else {
          local_d0 = local_130;
        }
        local_c8 = local_128;
        local_128 = 0;
        local_120[0] = 0;
        local_130 = local_120;
        ::std::__cxx11::string::operator=((string *)name,(string *)&local_d0);
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
        if (local_130 != local_120) {
          operator_delete(local_130);
        }
      }
      __n = name->_M_string_length;
      if (__n == local_e8) {
        if (__n == 0) {
          bVar5 = true;
        }
        else {
          iVar3 = bcmp((name->_M_dataplus)._M_p,local_f0,__n);
          bVar5 = iVar3 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      puVar4 = local_f0;
      if (local_f0 == local_e0) {
        return bVar5;
      }
      goto LAB_00115dfd;
    }
    ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)name);
    bVar5 = check_sname(this,&local_b0);
    psVar2 = &local_b0;
  }
  puVar4 = *(undefined1 **)((psVar2->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 == &psVar2->field_2) {
    return bVar5;
  }
LAB_00115dfd:
  operator_delete(puVar4);
  return bVar5;
}

Assistant:

bool check_name(std::string name) const {

        if(name.length() > 2 && name.substr(0, 2) == "--")
            return check_lname(name.substr(2));
        else if(name.length() > 1 && name.substr(0, 1) == "-")
            return check_sname(name.substr(1));
        else {
            std::string local_pname = pname_;
            if(ignore_case_) {
                local_pname = detail::to_lower(local_pname);
                name = detail::to_lower(name);
            }
            return name == local_pname;
        }
    }